

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

nn_trie_node * nn_node_compact(nn_trie_node *self)

{
  nn_trie_node *pnVar1;
  
  if ((self->refcount == 0) && (self->type == '\x01')) {
    pnVar1 = *(nn_trie_node **)(self + 1);
    if ((uint)pnVar1->prefix_len + (uint)self->prefix_len < 10) {
      memmove(pnVar1->prefix + (ulong)self->prefix_len + 1,pnVar1->prefix,(ulong)pnVar1->prefix_len)
      ;
      memcpy(pnVar1->prefix,self->prefix,(ulong)self->prefix_len);
      pnVar1->prefix[self->prefix_len] = (self->u).sparse.children[0];
      pnVar1->prefix_len = self->prefix_len + pnVar1->prefix_len + '\x01';
      nn_free(self);
      self = pnVar1;
    }
  }
  return self;
}

Assistant:

struct nn_trie_node *nn_node_compact (struct nn_trie_node *self)
{
    /*  Tries to merge the node with the child node. Returns pointer to
        the compacted node. */

    struct nn_trie_node *ch;

    /*  Node that is a subscription cannot be compacted. */
    if (nn_node_has_subscribers (self))
        return self;

    /*  Only a node with a single child can be compacted. */
    if (self->type != 1)
        return self;

    /*  Check whether combined prefixes would fix into a single node. */
    ch = *nn_node_child (self, 0);
    if (self->prefix_len + ch->prefix_len + 1 > NN_TRIE_PREFIX_MAX)
        return self;

    /*  Concatenate the prefixes. */
    memmove (ch->prefix + self->prefix_len + 1, ch->prefix, ch->prefix_len);
    memcpy (ch->prefix, self->prefix, self->prefix_len);
    ch->prefix [self->prefix_len] = self->u.sparse.children [0];
    ch->prefix_len += self->prefix_len + 1;

    /*  Get rid of the obsolete parent node. */
    nn_free (self);

    /*  Return the new compacted node. */
    return ch;
}